

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitDsd.c
# Opt level: O2

void Kit_DsdManFree(Kit_DsdMan_t *p)

{
  Vec_Int_t *__ptr;
  
  Cloud_Quit(p->dd);
  __ptr = p->vNodes;
  free(__ptr->pArray);
  free(__ptr);
  Vec_PtrFree(p->vTtBdds);
  Vec_PtrFree(p->vTtElems);
  Vec_PtrFree(p->vTtNodes);
  free(p);
  return;
}

Assistant:

void Kit_DsdManFree( Kit_DsdMan_t * p )
{
    Cloud_Quit( p->dd );
    Vec_IntFree( p->vNodes );
    Vec_PtrFree( p->vTtBdds );
    Vec_PtrFree( p->vTtElems );
    Vec_PtrFree( p->vTtNodes );
    ABC_FREE( p );
}